

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O2

void __thiscall
ki::dml::
Field<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
::from_xml(Field<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
           *this,xml_node<char> *node)

{
  xml_node<char> *pxVar1;
  bool bVar2;
  ostream *poVar3;
  value_error *pvVar4;
  char *pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  xml_node<char> *pxVar6;
  string local_248;
  string name;
  string local_208;
  string local_1e8;
  string value_1;
  string value;
  
  std::__cxx11::string::assign((char *)&(this->super_FieldBase).m_name);
  (this->super_FieldBase).m_transferable = true;
  pxVar1 = (xml_node<char> *)node->m_first_attribute;
  do {
    pxVar6 = pxVar1;
    if (pxVar6 == (xml_node<char> *)0x0) {
      pcVar5 = (node->super_xml_base<char>).m_value;
      if (pcVar5 == (char *)0x0) {
        pcVar5 = &rapidxml::xml_base<char>::nullstr()::zero;
      }
      std::__cxx11::string::string((string *)&value,pcVar5,(allocator *)&name);
      if (value._M_string_length != 0) {
        std::__cxx11::string::string((string *)&local_248,(string *)&value);
        set_value_from_string(this,&local_248);
        std::__cxx11::string::~string((string *)&local_248);
      }
      std::__cxx11::string::~string((string *)&value);
      return;
    }
    pcVar5 = (pxVar6->super_xml_base<char>).m_name;
    if (pcVar5 == (char *)0x0) {
      pcVar5 = &rapidxml::xml_base<char>::nullstr()::zero;
    }
    std::__cxx11::string::string((string *)&name,pcVar5,(allocator *)&value);
    bVar2 = std::operator==(&name,"TYPE");
    if (bVar2) {
      pcVar5 = (pxVar6->super_xml_base<char>).m_value;
      if (pcVar5 == (char *)0x0) {
        pcVar5 = &rapidxml::xml_base<char>::nullstr()::zero;
      }
      std::__cxx11::string::string((string *)&value_1,pcVar5,(allocator *)&value);
      pcVar5 = get_type_name(this);
      bVar2 = std::operator!=(&value_1,pcVar5);
      this_00 = &value_1;
      if (bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&value);
        std::operator<<((ostream *)&value,"XML Field node has incorrect TYPE attribute value. ");
        poVar3 = std::operator<<((ostream *)&value,"(value=\"");
        poVar3 = std::operator<<(poVar3,(string *)&value_1);
        poVar3 = std::operator<<(poVar3,"\", expected=\"");
        pcVar5 = get_type_name(this);
        poVar3 = std::operator<<(poVar3,pcVar5);
        std::operator<<(poVar3,"\". ");
        pvVar4 = (value_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        value_error::value_error(pvVar4,&local_1e8);
        __cxa_throw(pvVar4,&value_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      bVar2 = std::operator==(&name,"NOXFER");
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&value);
        poVar3 = std::operator<<((ostream *)&value,"XML Field node has unknown attribute \"");
        poVar3 = std::operator<<(poVar3,(string *)&name);
        std::operator<<(poVar3,"\".");
        pvVar4 = (value_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        value_error::value_error(pvVar4,&local_208);
        __cxa_throw(pvVar4,&value_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pcVar5 = (pxVar6->super_xml_base<char>).m_value;
      if (pcVar5 == (char *)0x0) {
        pcVar5 = &rapidxml::xml_base<char>::nullstr()::zero;
      }
      std::__cxx11::string::string((string *)&value,pcVar5,(allocator *)&value_1);
      bVar2 = std::operator!=(&value,"TRUE");
      (this->super_FieldBase).m_transferable = bVar2;
      this_00 = &value;
    }
    std::__cxx11::string::~string((string *)this_00);
    std::__cxx11::string::~string((string *)&name);
    pxVar1 = (pxVar6->super_xml_base<char>).m_parent;
    if (pxVar1 != (xml_node<char> *)0x0) {
      pxVar1 = pxVar6->m_first_node;
    }
  } while( true );
}

Assistant:

void from_xml(const rapidxml::xml_node<> *node) final
		{
			// Use the name of the node as the field name and,
			// default transferable to TRUE.
			m_name = node->name();
			m_transferable = true;

			for (auto *attr = node->first_attribute();
				attr; attr = attr->next_attribute())
			{
				const std::string name = attr->name();
				if (name == "TYPE")
				{
					const std::string value = attr->value();
					if (value != get_type_name())
					{
						std::ostringstream oss;
						oss << "XML Field node has incorrect TYPE attribute value. ";
						oss << "(value=\"" << value << "\", expected=\"" << get_type_name() << "\". ";
						throw value_error(oss.str());
					}
				}
				else if (name == "NOXFER")
				{
					const std::string value = attr->value();
					m_transferable = value != "TRUE";
				}
				else
				{
					std::ostringstream oss;
					oss << "XML Field node has unknown attribute \"" << name << "\".";
					throw value_error(oss.str());
				}
			}

			const std::string value = node->value();
			if (!value.empty())
				set_value_from_string(value);
		}